

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

size_t nhdp_domain_encode_mpr_tlvvalue(uint8_t *tlvvalue,size_t tlvsize,nhdp_link *lnk)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  list_entity *plVar6;
  
  memset(tlvvalue,0,tlvsize);
  if (lnk->neigh_is_flooding_mpr == true) {
    *tlvvalue = *tlvvalue | 1;
  }
  if ((log_global_mask[LOG_NHDP_W] & 1) != 0) {
    pcVar4 = "false";
    if (lnk->neigh_is_flooding_mpr != false) {
      pcVar4 = "true";
    }
    oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x31e,(void *)0x0,0,
             "Set flooding MPR: %s",pcVar4);
  }
  plVar6 = &_domain_list;
  uVar5 = 0;
  while( true ) {
    plVar6 = plVar6->next;
    if (plVar6->prev == _domain_list.prev) {
      return uVar5;
    }
    iVar1 = *(int *)((long)&plVar6[-0x27].next + 4);
    iVar3 = iVar1 + 1;
    uVar2 = (ulong)(iVar3 >> 3);
    if (tlvsize <= uVar2) break;
    if (uVar5 < uVar2 + 1) {
      uVar5 = uVar2 + 1;
    }
    if (lnk->neigh->_domaindata[iVar1].neigh_is_mpr == true) {
      tlvvalue[uVar2] = tlvvalue[uVar2] | (byte)(1 << ((byte)iVar3 & 7));
    }
    if ((log_global_mask[LOG_NHDP_W] & 1) != 0) {
      pcVar4 = "false";
      if (lnk->neigh->_domaindata[*(int *)((long)&plVar6[-0x27].next + 4)].neigh_is_mpr != false) {
        pcVar4 = "true";
      }
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x330,(void *)0x0,0,
               "Set routing MPR for domain %u: %s",(ulong)*(byte *)((long)&plVar6[-0x27].next + 1),
               pcVar4);
    }
  }
  return 0;
}

Assistant:

size_t
nhdp_domain_encode_mpr_tlvvalue(uint8_t *tlvvalue, size_t tlvsize, struct nhdp_link *lnk) {
  struct nhdp_domain *domain;
  size_t bit_idx, byte_idx, len;

  memset(tlvvalue, 0, tlvsize);
  len = 0;
  /* set flooding MPR flag */
  if (lnk->neigh_is_flooding_mpr) {
    tlvvalue[0] |= RFC7181_MPR_FLOODING;
  }

  OONF_DEBUG(LOG_NHDP_W, "Set flooding MPR: %s", lnk->neigh_is_flooding_mpr ? "true" : "false");

  list_for_each_element(&_domain_list, domain, _node) {
    bit_idx = (domain->index + 1) & 7;
    byte_idx = (domain->index + 1) >> 3;

    if (byte_idx >= tlvsize) {
      return 0;
    }
    if (byte_idx + 1 > len) {
      len = byte_idx + 1;
    }

    if (nhdp_domain_get_neighbordata(domain, lnk->neigh)->neigh_is_mpr) {
      tlvvalue[byte_idx] |= (1 << bit_idx);
    }

    OONF_DEBUG(LOG_NHDP_W, "Set routing MPR for domain %u: %s", domain->ext,
      nhdp_domain_get_neighbordata(domain, lnk->neigh)->neigh_is_mpr ? "true" : "false");
  }
  return len;
}